

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O1

TextureLevel *
vkt::image::anon_unknown_0::generateReferenceImage
          (TextureLevel *__return_storage_ptr__,IVec3 *imageSize,VkFormat imageFormat,
          VkFormat readFormat)

{
  long lVar1;
  float fVar2;
  VkFormat VVar3;
  bool bVar4;
  Float<unsigned_short,_5,_10,_15,_3U> FVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  uint y;
  VkFormat format;
  uint x;
  int i_3;
  uint uVar8;
  long lVar9;
  int iVar10;
  int y_00;
  uint uVar11;
  int iVar12;
  deUint32 u32;
  IVec4 color;
  Vector<float,_4> res_2;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  PixelBufferAccess access;
  undefined1 local_130 [16];
  ulong local_120;
  undefined1 local_118 [8];
  void *pvStack_110;
  VkFormat local_fc;
  VkFormat local_f8;
  float local_f4;
  IVec3 *local_f0;
  int local_e8;
  float local_e4;
  TextureLevel *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  TextureFormat local_c8;
  undefined8 uStack_c0;
  PixelBufferAccess local_b8;
  PixelBufferAccess local_90;
  PixelBufferAccess local_68;
  IVec3 local_40;
  
  local_68.super_ConstPixelBufferAccess.m_format = ::vk::mapVkFormat(imageFormat);
  tcu::TextureLevel::TextureLevel
            (__return_storage_ptr__,(TextureFormat *)&local_68,imageSize->m_data[0],
             imageSize->m_data[1],imageSize->m_data[2]);
  local_e0 = __return_storage_ptr__;
  tcu::TextureLevel::getAccess(&local_68,__return_storage_ptr__);
  local_40.m_data[2] = imageSize->m_data[2];
  local_40.m_data._0_8_ = *(undefined8 *)imageSize->m_data;
  local_e4 = computeStoreColorScale(imageFormat,&local_40);
  bVar4 = ::vk::isSnormFormat(imageFormat);
  if (bVar4) {
    local_f4 = -1.0;
  }
  else {
    local_f4 = 0.0;
  }
  bVar4 = ::vk::isIntFormat(imageFormat);
  local_120 = CONCAT71(local_120._1_7_,1);
  if (!bVar4) {
    bVar4 = ::vk::isUintFormat(imageFormat);
    local_120 = CONCAT71(local_120._1_7_,bVar4);
  }
  local_fc = imageFormat;
  local_f8 = readFormat;
  if (0 < imageSize->m_data[2]) {
    local_f0 = (IVec3 *)CONCAT44(local_f0._4_4_,imageSize->m_data[0]);
    local_e8 = imageSize->m_data[1];
    uVar11 = 0;
    do {
      if (0 < imageSize->m_data[1]) {
        y = 0;
        do {
          if (0 < imageSize->m_data[0]) {
            uVar8 = ~y + local_e8 ^ uVar11;
            x = 0;
            do {
              local_130._0_4_ = y ^ uVar11 ^ x;
              local_130._4_4_ = y ^ uVar11 ^ ~x + (int)local_f0;
              local_130._8_4_ = uVar8 ^ x;
              local_130._12_4_ = ~x + (int)local_f0 ^ uVar8;
              if ((char)local_120 == '\0') {
                local_d8 = 0;
                uStack_d0 = 0;
                lVar9 = 0;
                do {
                  *(float *)((long)&local_d8 + lVar9 * 4) = (float)*(int *)(local_130 + lVar9 * 4);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                local_c8.order = R;
                local_c8.type = SNORM_INT8;
                uStack_c0 = 0;
                lVar9 = 0;
                do {
                  (&local_c8.order)[lVar9] =
                       (ChannelOrder)(*(float *)((long)&local_d8 + lVar9 * 4) * local_e4);
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                local_118._0_4_ = 0.0;
                local_118._4_4_ = 0.0;
                pvStack_110 = (void *)0x0;
                lVar9 = 0;
                do {
                  *(float *)(local_118 + lVar9 * 4) = (float)(&local_c8.order)[lVar9] + local_f4;
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                tcu::PixelBufferAccess::setPixel(&local_68,(Vec4 *)local_118,x,y,uVar11);
              }
              else {
                tcu::PixelBufferAccess::setPixel(&local_68,(IVec4 *)local_130,x,y,uVar11);
              }
              x = x + 1;
            } while ((int)x < imageSize->m_data[0]);
          }
          y = y + 1;
        } while ((int)y < imageSize->m_data[1]);
      }
      uVar11 = uVar11 + 1;
    } while ((int)uVar11 < imageSize->m_data[2]);
  }
  format = local_f8;
  bVar4 = ::vk::isFloatFormat(local_f8);
  if ((local_fc != format) && (bVar4)) {
    local_c8 = ::vk::mapVkFormat(format);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_b8,&local_c8,imageSize,local_68.super_ConstPixelBufferAccess.m_data);
    format = local_f8;
    local_f0 = imageSize;
    if (0 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      local_120 = 0;
      do {
        if (0 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[1]) {
          iVar12 = 0;
          do {
            if (0 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[0]) {
              iVar10 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)local_130,(int)&local_b8,iVar10,iVar12);
                local_118._4_4_ = local_130._4_4_;
                local_118._0_4_ = local_130._0_4_;
                pvStack_110 = (void *)CONCAT44(local_130._12_4_,local_130._8_4_);
                lVar9 = 0;
                do {
                  if (local_b8.super_ConstPixelBufferAccess.m_format.type == HALF_FLOAT) {
                    local_d8 = CONCAT44(local_d8._4_4_,*(undefined4 *)(local_130 + lVar9 * 4));
                    FVar5 = tcu::Float<unsigned_short,5,10,15,3u>::convert<unsigned_int,8,23,127,3u>
                                      ((Float<unsigned_int,_8,_23,_127,_3U> *)&local_d8);
                    if (((FVar5.m_value & 0x7fff) == 0x7c00) ||
                       ((FVar5.m_value & 0x3ff) != 0 &&
                        ((FVar5.m_value & 0x7c00) == 0 || (FVar5.m_value & 0x7c00) == 0x7c00))) {
LAB_0071fc66:
                      *(undefined4 *)(local_118 + lVar9 * 4) = 0;
                    }
                  }
                  else {
                    uVar11 = *(uint *)(local_130 + lVar9 * 4);
                    if (((uVar11 & 0x7fffffff) == 0x7f800000) ||
                       ((uVar11 & 0x7fffff) != 0 &&
                        ((uVar11 & 0x7f800000) == 0 || (uVar11 & 0x7f800000) == 0x7f800000)))
                    goto LAB_0071fc66;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                if (((float)local_118._0_4_ != (float)local_130._0_4_) ||
                   (NAN((float)local_118._0_4_) || NAN((float)local_130._0_4_))) {
LAB_0071fcbb:
                  tcu::PixelBufferAccess::setPixel
                            (&local_b8,(Vec4 *)local_118,iVar10,iVar12,(int)local_120);
                }
                else {
                  uVar6 = 0xffffffffffffffff;
                  while (uVar6 != 2) {
                    fVar2 = *(float *)((long)&pvStack_110 + uVar6 * 4);
                    uVar7 = uVar6 + 1;
                    lVar9 = uVar6 * 4;
                    if ((fVar2 != *(float *)(local_130 + lVar9 + 8)) ||
                       (uVar6 = uVar7, NAN(fVar2) || NAN(*(float *)(local_130 + lVar9 + 8))))
                    goto LAB_0071fcb5;
                  }
                  uVar7 = 3;
LAB_0071fcb5:
                  if (uVar7 < 3) goto LAB_0071fcbb;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[0]);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[1]);
        }
        uVar11 = (int)local_120 + 1;
        local_120 = (ulong)uVar11;
        imageSize = local_f0;
        format = local_f8;
      } while ((int)uVar11 < local_b8.super_ConstPixelBufferAccess.m_size.m_data[2]);
    }
  }
  VVar3 = local_fc;
  bVar4 = ::vk::isSnormFormat(format);
  if ((VVar3 != format) && (bVar4)) {
    local_c8 = ::vk::mapVkFormat(format);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_90,&local_c8,imageSize,local_68.super_ConstPixelBufferAccess.m_data);
    if (0 < local_90.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar12 = 0;
      do {
        if (0 < local_90.super_ConstPixelBufferAccess.m_size.m_data[1]) {
          iVar10 = 0;
          do {
            if (0 < local_90.super_ConstPixelBufferAccess.m_size.m_data[0]) {
              y_00 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_130,(int)&local_90,y_00,iVar10);
                local_118._4_4_ = local_130._4_4_;
                local_118._0_4_ = local_130._0_4_;
                pvStack_110 = (void *)CONCAT44(local_130._12_4_,local_130._8_4_);
                lVar9 = 0;
                do {
                  if (*(int *)(local_130 + lVar9 * 4) == -0x80) {
                    *(undefined4 *)(local_118 + lVar9 * 4) = 0xffffff81;
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 4);
                if (local_118._0_4_ == local_130._0_4_) {
                  uVar6 = 0xffffffffffffffff;
                  do {
                    if (uVar6 == 2) {
                      uVar7 = 3;
                      break;
                    }
                    lVar9 = uVar6 * 4;
                    uVar7 = uVar6 + 1;
                    lVar1 = uVar6 * 4;
                    uVar6 = uVar7;
                  } while (*(int *)((long)&pvStack_110 + lVar9) == *(int *)(local_130 + lVar1 + 8));
                  if (uVar7 < 3) goto LAB_0071fe0d;
                }
                else {
LAB_0071fe0d:
                  tcu::PixelBufferAccess::setPixel(&local_90,(IVec4 *)local_118,y_00,iVar10,iVar12);
                }
                y_00 = y_00 + 1;
              } while (y_00 < local_90.super_ConstPixelBufferAccess.m_size.m_data[0]);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < local_90.super_ConstPixelBufferAccess.m_size.m_data[1]);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < local_90.super_ConstPixelBufferAccess.m_size.m_data[2]);
    }
  }
  return local_e0;
}

Assistant:

tcu::TextureLevel generateReferenceImage (const tcu::IVec3& imageSize, const VkFormat imageFormat, const VkFormat readFormat)
{
	// Generate a reference image data using the storage format

	tcu::TextureLevel reference(mapVkFormat(imageFormat), imageSize.x(), imageSize.y(), imageSize.z());
	const tcu::PixelBufferAccess access = reference.getAccess();

	const float storeColorScale = computeStoreColorScale(imageFormat, imageSize);
	const float storeColorBias = computeStoreColorBias(imageFormat);

	const bool intFormat = isIntegerFormat(imageFormat);
	const int xMax = imageSize.x() - 1;
	const int yMax = imageSize.y() - 1;

	for (int z = 0; z < imageSize.z(); ++z)
	for (int y = 0; y < imageSize.y(); ++y)
	for (int x = 0; x < imageSize.x(); ++x)
	{
		const tcu::IVec4 color(x^y^z, (xMax - x)^y^z, x^(yMax - y)^z, (xMax - x)^(yMax - y)^z);

		if (intFormat)
			access.setPixel(color, x, y, z);
		else
			access.setPixel(color.asFloat()*storeColorScale + storeColorBias, x, y, z);
	}

	// If the image is to be accessed as a float texture, get rid of invalid values

	if (isFloatFormat(readFormat) && imageFormat != readFormat)
		replaceBadFloatReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));
	if (isSnormFormat(readFormat) && imageFormat != readFormat)
		replaceSnormReinterpretValues(tcu::PixelBufferAccess(mapVkFormat(readFormat), imageSize, access.getDataPtr()));

	return reference;
}